

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::SubRoutineLocArrays::Run(SubRoutineLocArrays *this)

{
  long lVar1;
  UniformValueGenerator *generator;
  DefOccurence local_1fc;
  LayoutSpecifierBase local_1f8;
  LayoutSpecifierBase local_1d8;
  SubroutineUniform local_1c8;
  undefined1 local_60 [8];
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunctionSet functions_st0;
  SubRoutineLocArrays *this_local;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet
            ((SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,generator,2);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
            *)local_60);
  local_1f8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(1,Dec);
  local_1d8 = local_1f8;
  DefOccurence::DefOccurence(&local_1fc,ALL_SH);
  SubroutineUniform::SubroutineUniform
            (&local_1c8,generator,
             (SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Loc)local_1d8,2,local_1fc,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_60,&local_1c8);
  SubroutineUniform::~SubroutineUniform(&local_1c8);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      *)local_60);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             *)local_60);
  SubroutineFunctionSet::~SubroutineFunctionSet
            ((SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return lVar1;
}

Assistant:

virtual long Run()
	{

		//subroutine vec4 st0(float param);
		//subroutine(st0) vec4 sf0(float param) { .... };
		//subroutine(st0) vec4 sf1(float param) { .... };
		SubroutineFunctionSet functions_st0(uniformValueGenerator, 2);

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 1) subroutine uniform st0 u0[2];
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(1), 2));
		return doRun(subroutineUniforms);
	}